

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O0

void __thiscall mp::NLSolution::NLSolution(NLSolution *this,NLSolution *param_2)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  NLSuffixSet *in_stack_ffffffffffffffb8;
  NLSuffixSet *this_00;
  
  *in_RDI = *in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 1));
  in_RDI[5] = in_RSI[5];
  std::vector<double,_std::allocator<double>_>::vector(in_stack_00000010,in_stack_00000008);
  this_00 = (NLSuffixSet *)(in_RDI + 9);
  std::vector<double,_std::allocator<double>_>::vector(in_stack_00000010,in_stack_00000008);
  NLSuffixSet::NLSuffixSet(this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

operator bool() const { return solve_result_ > -2; }